

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::impl::operator>>(basic_istream<char,_std::char_traits<char>_> *in,uint128 *value)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  uint128 result;
  uint128 local_48;
  uint128 *local_38;
  
  uVar3 = *(uint *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  std::ws<char,std::char_traits<char>>((istream *)in);
  uVar2 = std::istream::peek();
  iVar1 = (int)in;
  if ((uVar3 & 0x4a) == 8) {
    if ((uVar2 - 0x30 < 10) ||
       ((uVar2 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(uVar2 - 0x41) & 0x3f) & 1) != 0)))) {
      local_48.m_lo = 0;
      local_48.m_hi = 0;
      iVar4 = 1;
      while( true ) {
        while( true ) {
          iVar5 = std::istream::peek();
          if (((9 < iVar5 - 0x30U) &&
              ((0x25 < iVar5 - 0x41U ||
               ((0x3f0000003fU >> ((ulong)(iVar5 - 0x41U) & 0x3f) & 1) == 0)))) &&
             ((iVar4 != 0 || (uVar3 = std::istream::peek(), (uVar3 & 0xffffffdf) != 0x58)))) {
            value->m_lo = local_48.m_lo;
            value->m_hi = local_48.m_hi;
            return in;
          }
          bVar7 = iVar4 != 0;
          iVar4 = iVar4 + -1;
          if ((bVar7) || (uVar3 = std::istream::peek(), (uVar3 & 0xffffffdf) != 0x58)) break;
          std::istream::get();
        }
        if (local_48.m_hi >> 0x3c != 0) break;
        portable_impl::uint128::operator*=(&local_48,(uint128)ZEXT816(0x10));
        iVar5 = std::istream::get();
        if (iVar5 - 0x30U < 10) {
          uVar6 = (ulong)(iVar5 - 0x30U);
        }
        else if (iVar5 - 0x61U < 6) {
          uVar6 = (ulong)(iVar5 - 0x57);
        }
        else {
          uVar6 = (ulong)(iVar5 + -0x37);
        }
        bVar7 = CARRY8(local_48.m_lo,uVar6);
        local_48.m_lo = local_48.m_lo + uVar6;
        local_48.m_hi = local_48.m_hi + bVar7;
      }
    }
  }
  else {
    if ((uVar3 & 0x4a) != 0x40) {
      if (9 < uVar2 - 0x30) {
        std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)in + -0x18));
        return in;
      }
      local_48.m_lo = 0;
      local_48.m_hi = 0;
      local_38 = value;
      while( true ) {
        iVar4 = std::istream::peek();
        if (iVar4 - 0x3aU < 0xfffffff6) {
          local_38->m_lo = local_48.m_lo;
          local_38->m_hi = local_48.m_hi;
          return in;
        }
        if ((0x1999999999999999 < local_48.m_hi) ||
           ((local_48.m_hi == 0x1999999999999999 && (0x9999999999999999 < local_48.m_lo)))) break;
        portable_impl::uint128::operator*=(&local_48,(uint128)ZEXT816(10));
        iVar4 = std::istream::get();
        uVar6 = (ulong)(iVar4 + -0x30);
        if (CARRY8(local_48.m_lo,uVar6) && local_48.m_hi == 0xffffffffffffffff) {
          std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)in + -0x18));
          return in;
        }
        bVar7 = CARRY8(local_48.m_lo,uVar6);
        local_48.m_lo = local_48.m_lo + uVar6;
        local_48.m_hi = local_48.m_hi + bVar7;
      }
      std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)in + -0x18));
      return in;
    }
    if ((uVar2 & 0xfffffff8) == 0x30) {
      local_48.m_lo = 0;
      local_48.m_hi = 0;
      uVar3 = std::istream::peek();
      if ((uVar3 & 0xfffffff8) == 0x30) {
        if (local_48.m_hi >> 0x3d == 0) {
          do {
            portable_impl::uint128::operator*=(&local_48,(uint128)ZEXT816(8));
            iVar4 = std::istream::get();
            bVar7 = CARRY8(local_48.m_lo,(long)(iVar4 + -0x30));
            local_48.m_lo = local_48.m_lo + (long)(iVar4 + -0x30);
            local_48.m_hi = local_48.m_hi + bVar7;
            uVar3 = std::istream::peek();
            if ((uVar3 & 0xfffffff8) != 0x30) goto LAB_0029e3ea;
          } while (local_48.m_hi < 0x2000000000000000);
        }
        std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)in + -0x18));
        return in;
      }
LAB_0029e3ea:
      value->m_lo = local_48.m_lo;
      value->m_hi = local_48.m_hi;
      return in;
    }
  }
  std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)in + -0x18));
  return in;
}

Assistant:

std::basic_istream<T,
        TRAIT> &operator>>(std::basic_istream<T,
        TRAIT> &in, UINT128 &value) {
      const auto stream_flags{in.flags()};

      const auto is_dec_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('9');
      };
      const auto dec_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_oct_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('7');
      };
      const auto oct_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_hex_digit = [](typename TRAIT::int_type c) -> bool {
        return (T('0') <= c and c <= T('9')) or (T('a') <= c and c <= T('f')) or
               (T('A') <= c and c <= T('F'));
      };
      const auto is_hex_basechar = [](typename TRAIT::int_type c) -> bool {
        return c == T('x') or c == T('X');
      };
      const auto hex_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        if (T('0') <= c and c <= T('9'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
        if (T('a') <= c and c <= T('f'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('a') + 10));
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('A') + 10));
      };

      in >> std::ws;

      switch (stream_flags & std::ios_base::basefield) {
        case std::ios_base::oct: {
          const UINT128 mult_overflow{0x2000000000000000, 0x000000000000000};  // 2^128 / 8
          if (not is_oct_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_oct_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(8));
            result += oct_digit_to_uint128(in.get());
          }
          value = result;
        }
          break;
        case std::ios_base::dec:
        default: {
          const UINT128 mult_overflow{0x1999999999999999,
                                      0x999999999999999a};  // ceil(2^128 / 10)
          const UINT128 max{0xffffffffffffffff, 0xffffffffffffffff};  // 2^128 - 1
          if (not is_dec_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_dec_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(10));
            const auto next_digit{dec_digit_to_uint128(in.get())};
            if (next_digit > max - result) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result += next_digit;
          }
          value = result;
        }
          break;
        case std::ios_base::hex: {
          const UINT128 mult_overflow{0x1000000000000000, 0x000000000000000};  // 2^128 / 16
          if (not is_hex_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          int pos{0};
          while (is_hex_digit(in.peek()) or (pos == 1 and is_hex_basechar(in.peek()))) {
            if (pos == 1 and is_hex_basechar(in.peek())) {
              in.get();
            } else {
              if (result >= mult_overflow) {
                in.setstate(std::ios_base::failbit);
                return in;
              }
              result *= static_cast<UINT128>(static_cast<std::uint64_t>(16));
              result += hex_digit_to_uint128(in.get());
            }
            ++pos;
          }
          value = result;
        }
          break;
      }

      return in;
    }